

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O2

int Abc_NtkCountSelfFeedLatches(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pLatch;
  int i;
  int iVar2;
  
  iVar2 = 0;
  for (i = 0; i < pNtk->vBoxes->nSize; i = i + 1) {
    pLatch = Abc_NtkBox(pNtk,i);
    if ((*(uint *)&pLatch->field_0x14 & 0xf) == 8) {
      iVar1 = Abc_NtkLatchIsSelfFeed(pLatch);
      iVar2 = iVar2 + iVar1;
    }
  }
  return iVar2;
}

Assistant:

int Abc_NtkCountSelfFeedLatches( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pLatch;
    int i, Counter;
    Counter = 0;
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
//        if ( Abc_NtkLatchIsSelfFeed(pLatch) && Abc_ObjFanoutNum(pLatch) > 1 )
//            printf( "Fanouts = %d.\n", Abc_ObjFanoutNum(pLatch) );
        Counter += Abc_NtkLatchIsSelfFeed( pLatch );
    }
    return Counter;
}